

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashAddEntry(xmlHashTablePtr hash,xmlChar *key,void *payload)

{
  undefined4 local_24;
  int res;
  void *payload_local;
  xmlChar *key_local;
  xmlHashTablePtr hash_local;
  
  local_24 = xmlHashUpdateInternal
                       (hash,key,(xmlChar *)0x0,(xmlChar *)0x0,payload,(xmlHashDeallocator)0x0,0);
  if (local_24 == 0) {
    local_24 = -1;
  }
  else if (local_24 == 1) {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

int
xmlHashAddEntry(xmlHashTablePtr hash, const xmlChar *key, void *payload) {
    int res = xmlHashUpdateInternal(hash, key, NULL, NULL, payload, NULL, 0);

    if (res == 0)
        res = -1;
    else if (res == 1)
        res = 0;

    return(res);
}